

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void __thiscall Liby::http::HttpClient::sendRequest(HttpClient *this)

{
  _List_node_base *p_Var1;
  size_t in_RCX;
  int in_R8D;
  Buffer buffer;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  Buffer local_38;
  
  p_Var1 = (this->requestLists_).
           super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  Buffer::Buffer(&local_38,0x400);
  Request::toString_abi_cxx11_((string *)&local_58,(Request *)(p_Var1 + 1));
  Buffer::append(&local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)local_58._M_pod_data);
  Buffer::append(&local_38,(Buffer *)(p_Var1 + 9));
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:68:30)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:68:30)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  Connection::send((this->http_conn_).
                   super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (int)&local_38,&local_58,in_RCX,in_R8D);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::push_back(&this->sendReqeustLists_,
              (value_type *)
              ((this->requestLists_).
               super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::pop_front(&this->requestLists_);
  Buffer::~Buffer(&local_38);
  return;
}

Assistant:

void HttpClient::sendRequest() {
    auto &request = requestLists_.front().first;
    Buffer buffer(1024);
    buffer.append(request.toString());
    buffer.append(request.body_);
    http_conn_->send(buffer, [this] {
        http_conn_->enableRead();
        if (requestLists_.empty())
            return;
        sendRequest();
    });
    sendReqeustLists_.push_back(requestLists_.front());
    requestLists_.pop_front();
}